

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool __thiscall argparse::Argument::get<bool>(Argument *this)

{
  bool bVar1;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  any *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = std::vector<std::any,_std::allocator<std::any>_>::empty
                    ((vector<std::any,_std::allocator<std::any>_> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    bVar1 = std::any::has_value((any *)&in_RDI[2]._M_string_length);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
      std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::operator+(in_RDI,(char *)this_00);
      std::logic_error::logic_error(this_00,(string *)&stack0xffffffffffffffd0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_1 = std::any_cast<bool>(in_stack_ffffffffffffff90);
  }
  else {
    std::vector<std::any,_std::allocator<std::any>_>::front
              ((vector<std::any,_std::allocator<std::any>_> *)in_stack_ffffffffffffff90);
    local_1 = std::any_cast<bool>(in_stack_ffffffffffffff90);
  }
  return local_1;
}

Assistant:

T get() const {
            if (!mValues.empty()) {
                if constexpr (details::is_container_v<T>)
                    return any_cast_container<T>(mValues);
                else
                    return std::any_cast<T>(mValues.front());
            }
            if (mDefaultValue.has_value()) {
                return std::any_cast<T>(mDefaultValue);
            }
            throw std::logic_error("No value provided for '" + mNames.back() + "'.");
        }